

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void sendOneToWSRCohort(WS_ReaderInfo CP_WSR_Stream,CMFormat f,void *Msg,void **RS_StreamPtr)

{
  SstStream s;
  int iVar1;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int res_1;
  CMConnection conn_1;
  int peer_1;
  int res;
  CMConnection conn;
  int peer;
  int j;
  SstStream Stream;
  undefined8 in_stack_ffffffffffffffb8;
  long lVar2;
  StreamStatus NewState;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  
  s = (SstStream)*in_RDI;
  local_2c = 0;
  if (s->ConfigParams->CPCommPattern == 1) {
    while (*(int *)(in_RDI[0x10] + (long)local_2c * 4) != -1) {
      uVar3 = *(uint *)(in_RDI[0x10] + (long)local_2c * 4);
      lVar2 = *(long *)(in_RDI[0x11] + (long)(int)uVar3 * 0x18 + 0x10);
      *in_RCX = *(undefined8 *)(in_RDI[0x11] + (long)(int)uVar3 * 0x18 + 8);
      CP_verbose(s,TraceVerbose,"Sending a message to reader %d (%p)\n",(ulong)uVar3,*in_RCX);
      if (lVar2 != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
        iVar1 = CMwrite(lVar2,in_RSI,in_RDX);
        pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
        if (iVar1 != 1) {
          CP_verbose(s,PerStepVerbose,"Message failed to send to reader %d (%p)\n",(ulong)uVar3,
                     *in_RCX);
          CP_PeerFailCloseWSReader
                    ((WS_ReaderInfo)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                     (StreamStatus)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
      }
      local_2c = local_2c + 1;
    }
  }
  else if (s->Rank == 0) {
    uVar3 = 0;
    lVar2 = *(long *)(in_RDI[0x11] + 0x10);
    *in_RCX = *(undefined8 *)(in_RDI[0x11] + 8);
    CP_verbose(s,TraceVerbose,"Sending a message to reader %d (%p)\n",0,*in_RCX);
    if (lVar2 != 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
      iVar1 = CMwrite(lVar2,in_RSI,in_RDX);
      NewState = (StreamStatus)((ulong)lVar2 >> 0x20);
      pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
      if (iVar1 != 1) {
        CP_verbose(s,PerStepVerbose,"Message failed to send to reader %d (%p)\n",(ulong)uVar3,
                   *in_RCX);
        CP_PeerFailCloseWSReader((WS_ReaderInfo)CONCAT44(in_stack_ffffffffffffffc4,uVar3),NewState);
      }
    }
  }
  return;
}

Assistant:

void sendOneToWSRCohort(WS_ReaderInfo CP_WSR_Stream, CMFormat f, void *Msg, void **RS_StreamPtr)
{
    SstStream Stream = CP_WSR_Stream->ParentStream;
    int j = 0;

    STREAM_ASSERT_LOCKED(Stream);
    if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
    {
        while (CP_WSR_Stream->Peers[j] != -1)
        {
            int peer = CP_WSR_Stream->Peers[j];
            CMConnection conn = CP_WSR_Stream->Connections[peer].CMconn;
            /* add the reader-rank-specific Stream identifier to each outgoing
             * message */
            *RS_StreamPtr = CP_WSR_Stream->Connections[peer].RemoteStreamID;
            CP_verbose(Stream, TraceVerbose, "Sending a message to reader %d (%p)\n", peer,
                       (void *)*RS_StreamPtr);

            if (conn)
            {
                int res;
                STREAM_MUTEX_UNLOCK(Stream);
                res = CMwrite(conn, f, Msg);
                STREAM_MUTEX_LOCK(Stream);
                if (res != 1)
                {
                    CP_verbose(Stream, PerStepVerbose, "Message failed to send to reader %d (%p)\n",
                               peer, (void *)*RS_StreamPtr);
                    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerFailed);
                }
            }
            j++;
        }
    }
    else
    {
        /* CommMin */
        if (Stream->Rank == 0)
        {
            int peer = 0;
            CMConnection conn = CP_WSR_Stream->Connections[peer].CMconn;
            /* add the reader-rank-specific Stream identifier to each outgoing
             * message */
            *RS_StreamPtr = CP_WSR_Stream->Connections[peer].RemoteStreamID;
            CP_verbose(Stream, TraceVerbose, "Sending a message to reader %d (%p)\n", peer,
                       (void *)*RS_StreamPtr);

            if (conn)
            {
                int res;
                STREAM_MUTEX_UNLOCK(Stream);
                res = CMwrite(conn, f, Msg);
                STREAM_MUTEX_LOCK(Stream);
                if (res != 1)
                {
                    CP_verbose(Stream, PerStepVerbose, "Message failed to send to reader %d (%p)\n",
                               peer, (void *)*RS_StreamPtr);
                    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerFailed);
                }
            }
        }
    }
}